

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

void __thiscall
amrex::AmrLevel::LevelDirectoryNames(AmrLevel *this,string *dir,string *LevelDir,string *FullPath)

{
  allocator local_69;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_68,"Level_",&local_69);
  Concatenate(&local_48,&local_68,this->level,1);
  std::__cxx11::string::operator=((string *)LevelDir,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::_M_assign((string *)FullPath);
  if ((FullPath->_M_string_length != 0) &&
     ((FullPath->_M_dataplus)._M_p[FullPath->_M_string_length - 1] != '/')) {
    std::__cxx11::string::push_back((char)FullPath);
  }
  std::__cxx11::string::append((string *)FullPath);
  return;
}

Assistant:

void
AmrLevel::LevelDirectoryNames (const std::string &dir,
                               std::string &LevelDir,
                               std::string &FullPath)
{
    LevelDir = amrex::Concatenate("Level_", level, 1);
    //
    // Now for the full pathname of that directory.
    //
    FullPath = dir;
    if( ! FullPath.empty() && FullPath.back() != '/') {
        FullPath += '/';
    }
    FullPath += LevelDir;
}